

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::Clone
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x158);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  this_00[1].fEquationFilter.fDestIndices.fNAlloc = 0x19c55e8;
  *(undefined8 *)this_00 = 0x19c56b0;
  *(undefined4 *)&this_00[1].field_0xa0 =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  this_00[1].field_0xa4 =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019c4f00,(TPZStructMatrix *)this);
  this_00[1].fEquationFilter.fDestIndices.fNAlloc = 0x19c50b8;
  *(undefined8 *)this_00 = 0x19c4fd8;
  TPZStructMatrixOT<double>::TPZStructMatrixOT
            ((TPZStructMatrixOT<double> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019c4f28,
             (TPZStructMatrixOT<double> *)
             &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  this_00[1].fEquationFilter.fDestIndices.fNAlloc = 0x19c4e80;
  *(undefined8 *)this_00 = 0x19c4ca0;
  *(undefined8 *)&this_00->field_0xa0 = 0x19c4d78;
  TPZVec<int>::TPZVec((TPZVec<int> *)&this_00[1].fEquationFilter.fActiveEqs.fNElements,
                      &this->fElementOrder);
  this_00[1].fEquationFilter.fDestIndices.fNElements = *(int64_t *)&this->f_quiet;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZFrontStructMatrix<TFront,TVar,TPar>::Clone(){
	
	auto* result =  new TPZFrontStructMatrix<TFront,TVar,TPar>(*this);
	return result;
}